

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::UpdateBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,Uint64 Offset,Uint64 Size,void *pData,
          RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)

{
  VulkanUploadAllocation TmpSpace;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,Offset,Size,pData,
             StateTransitionMode);
  if (pBuffer != (IBuffer *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  }
  if (*(char *)((long)&pBuffer[5].super_IDeviceObject.super_IObject._vptr_IObject + 4) == '\x02') {
    FormatString<char[42]>
              ((string *)local_50,(char (*) [42])"Dynamic buffers must be updated via Map()");
    DebugAssertionFailed
              ((Char *)local_50._0_8_,"UpdateBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x844);
    if ((VkBuffer)local_50._0_8_ != (VkBuffer)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_,local_40._M_allocated_capacity + 1);
    }
  }
  VulkanUploadHeap::Allocate((VulkanUploadAllocation *)local_50,&this->m_UploadHeap,Size,4);
  memcpy((void *)local_50._8_8_,pData,Size);
  UpdateBufferRegion(this,(BufferVkImpl *)pBuffer,Offset,Size,(VkBuffer)local_50._0_8_,
                     local_40._8_8_,StateTransitionMode);
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateBuffer(IBuffer*                       pBuffer,
                                       Uint64                         Offset,
                                       Uint64                         Size,
                                       const void*                    pData,
                                       RESOURCE_STATE_TRANSITION_MODE StateTransitionMode)
{
    TDeviceContextBase::UpdateBuffer(pBuffer, Offset, Size, pData, StateTransitionMode);

    // We must use cmd context from the device context provided, otherwise there will
    // be resource barrier issues in the cmd list in the device context
    BufferVkImpl* pBuffVk = ClassPtrCast<BufferVkImpl>(pBuffer);

    DEV_CHECK_ERR(pBuffVk->GetDesc().Usage != USAGE_DYNAMIC, "Dynamic buffers must be updated via Map()");

    constexpr size_t Alignment = 4;
    // Source buffer offset must be multiple of 4 (18.4)
    VulkanUploadAllocation TmpSpace = m_UploadHeap.Allocate(Size, Alignment);
    memcpy(TmpSpace.CPUAddress, pData, StaticCast<size_t>(Size));
    UpdateBufferRegion(pBuffVk, Offset, Size, TmpSpace.vkBuffer, TmpSpace.AlignedOffset, StateTransitionMode);
    // The allocation will stay in the upload heap until the end of the frame at which point all upload
    // pages will be discarded
}